

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazeFactory.cpp
# Opt level: O1

MazeFactory * MazeFactory::Instance(void)

{
  int iVar1;
  char *__s1;
  MazeFactory *pMVar2;
  
  if (_instance == (MazeFactory *)0x0) {
    __s1 = getenv("MAZESTYLE");
    iVar1 = strcmp(__s1,"bombed");
    if (iVar1 == 0) {
      pMVar2 = (MazeFactory *)operator_new(8);
      MazeFactory(pMVar2);
      pMVar2->_vptr_MazeFactory = (_func_int **)&PTR_MakeMaze_00107a70;
      _instance = pMVar2;
    }
    else {
      iVar1 = strcmp(__s1,"enchanted");
      pMVar2 = (MazeFactory *)operator_new(8);
      if (iVar1 == 0) {
        EnchantedMazeFactory::EnchantedMazeFactory((EnchantedMazeFactory *)pMVar2);
        _instance = pMVar2;
      }
      else {
        MazeFactory(pMVar2);
        _instance = pMVar2;
      }
    }
  }
  return _instance;
}

Assistant:

MazeFactory* MazeFactory::Instance () {

    if (_instance == 0) {

        const char* mazeStyle = getenv("MAZESTYLE");

        if (strcmp(mazeStyle, "bombed") == 0) {
            _instance = new BombedMazeFactory;

        } else if (strcmp(mazeStyle, "enchanted") == 0) {
            _instance = new EnchantedMazeFactory;

        // ... other possible subclasses

        } else {        // default
            _instance = new MazeFactory;
        }
    }
    return _instance;
}